

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

bool flatbuffers::EqualByName(Type *a,Type *b)

{
  StructDef *__lhs;
  StructDef *__rhs;
  EnumDef *__lhs_00;
  EnumDef *__rhs_00;
  __type _Var1;
  
  if ((a->base_type == b->base_type) && (a->element == b->element)) {
    __lhs = a->struct_def;
    __rhs = b->struct_def;
    if ((__lhs == __rhs) ||
       ((__rhs != (StructDef *)0x0 && __lhs != (StructDef *)0x0 &&
        (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__rhs), _Var1)))) {
      __lhs_00 = a->enum_def;
      __rhs_00 = b->enum_def;
      if (__lhs_00 == __rhs_00) {
        return true;
      }
      if (__rhs_00 != (EnumDef *)0x0 && __lhs_00 != (EnumDef *)0x0) {
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs_00,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs_00);
        return _Var1;
      }
    }
  }
  return false;
}

Assistant:

inline bool EqualByName(const Type &a, const Type &b) {
  return a.base_type == b.base_type && a.element == b.element &&
         (a.struct_def == b.struct_def ||
          (a.struct_def != nullptr && b.struct_def != nullptr &&
           a.struct_def->name == b.struct_def->name)) &&
         (a.enum_def == b.enum_def ||
          (a.enum_def != nullptr && b.enum_def != nullptr &&
           a.enum_def->name == b.enum_def->name));
}